

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

int __thiscall
KMaxDistance::compareVecOfMaxsWithAllVecsInNode
          (KMaxDistance *this,MaxRec *newRec,MaxRec *nodeRec,MaxRec **recsToOverWrite,
          int *numToOverwrite)

{
  int iVar1;
  uint uVar2;
  
  *numToOverwrite = 0;
  if (nodeRec == (MaxRec *)0x0) {
    uVar2 = 3;
  }
  else {
    do {
      if (nodeRec->isUsed != 0) {
        uVar2 = compareTwoVecsOfMaxs(this,nodeRec,newRec);
        if (uVar2 < 2) {
          return uVar2;
        }
        if (uVar2 == 2) {
          iVar1 = *numToOverwrite;
          recsToOverWrite[iVar1] = nodeRec;
          *numToOverwrite = iVar1 + 1;
          if (0x7ce < (long)iVar1) {
            puts("MAX_NUM_TO_OVERWRITE is too small");
            exit(1);
          }
        }
      }
      nodeRec = (MaxRec *)nodeRec->next;
    } while (nodeRec != (MaxRec *)0x0);
    uVar2 = 0 < *numToOverwrite ^ 3;
  }
  return uVar2;
}

Assistant:

int KMaxDistance::compareVecOfMaxsWithAllVecsInNode( MaxRec *newRec, const MaxRec *nodeRec, MaxRec **recsToOverWrite, int *numToOverwrite ){

    int result = 0;
    *numToOverwrite = 0;
    MaxRec *rec = (MaxRec*)nodeRec;
    while ( rec != NULL ){
        if ( rec->isUsed ){
            result = compareTwoVecsOfMaxs( rec, newRec );
            if ( result <= 1 ) return result;
            if ( result == 2 ){
                recsToOverWrite[*numToOverwrite] = rec;
                (*numToOverwrite)++;
                if ( *numToOverwrite >= MAX_NUM_TO_OVERWRITE ){ printf( "MAX_NUM_TO_OVERWRITE is too small\n" ); exit(1); } 
            }
        }
        rec = (MaxRec*)rec->next;
    }
    //if ( *numToOverwrite > 1 ) printf( "numToOverwrite=%d\n", *numToOverwrite );
    if ( *numToOverwrite > 0 ) return 2;
    return 3;
}